

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_pars.h
# Opt level: O1

void lowmc_compute(lowmc_parameters_t *lowmc,lowmc_key_t *key,mzd_local_t *x,mzd_local_t *y)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  lowmc_partial_round_t *plVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  mzd_local_t mStack_100;
  mzd_local_t mStack_e0;
  mzd_local_t mStack_c0;
  undefined1 auStack_a0 [32];
  mzd_local_t amStack_80 [2];
  
  uVar5 = (uint)lowmc->m | (uint)lowmc->n << 0x10;
  mStack_c0.w64[3] = (word)y;
  if ((~DAT_0019608c & 0x20400) != 0) {
    if (0xc0003f < (int)uVar5) {
      if (uVar5 == 0xc00040) {
        mStack_e0.w64[3] = 0x105f65;
        mzd_copy_s128_256((mzd_local_t *)auStack_a0,x);
        mStack_e0.w64[3] = 0x105f7e;
        mzd_addmul_v_s128_192((mzd_local_t *)auStack_a0,key,K_0);
        lVar7 = 0;
        do {
          auVar17 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d840);
          auVar11 = vpand_avx(auStack_a0._16_16_,_DAT_0010d7f0);
          auVar22 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d850);
          auVar12 = vpand_avx(auStack_a0._16_16_,_DAT_0010d810);
          auVar2 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d860);
          auVar3 = vpand_avx(auStack_a0._16_16_,_DAT_0010d830);
          auVar21 = vpsrldq_avx(auVar17,8);
          auVar11 = vpshldq_avx512_vbmi2(auVar11,auVar21,2);
          auVar21 = vpslldq_avx(auVar17,8);
          auVar21 = vpshldq_avx512_vbmi2(auVar17,auVar21,2);
          auVar17 = vpsrldq_avx(auStack_a0._0_16_,8);
          auVar12 = vpshldq_avx512_vbmi2(auVar12,auVar17,1);
          auVar17 = vpaddq_avx(auVar22,auVar22);
          auVar13 = vpternlogq_avx512vl(auVar21,auVar17,auVar2,0x78);
          auVar14 = vpternlogq_avx512vl(auVar12,auVar3,auVar11,0xd2);
          auVar22 = vpsrlq_avx(auVar14,1);
          auVar15 = vpternlogq_avx512vl(auVar22,auVar12,auVar11,0x1e);
          auVar11 = vpternlogq_avx512vl(auVar11,auVar12,auVar3,0x78);
          auVar22 = vpor_avx(auVar17,auVar21);
          auVar12 = vpternlogq_avx512vl(auVar17,auVar2,auVar21,0xd2);
          auVar17 = vpslldq_avx(auVar11,8);
          auVar23 = vpsllq_avx(auVar17,0x3e);
          auVar17 = vpsrldq_avx(auVar13,8);
          auVar17 = vpshldq_avx512_vbmi2(auVar17,auVar13,0x3e);
          auVar17 = vpor_avx(auVar23,auVar17);
          auVar13 = vpsrlq_avx(auVar11,2);
          auVar11 = vpslldq_avx(auVar14,8);
          auVar14 = vpsllq_avx(auVar11,0x3f);
          auVar11 = vpsrldq_avx(auVar21,8);
          auVar11 = vpshldq_avx512_vbmi2(auVar11,auVar12,0x3f);
          auVar22 = vpternlogq_avx512vl(auVar11,auVar22,auVar14,0x36);
          auStack_a0._0_16_ = vpternlogq_avx512vl(auVar22,auVar2,auVar17,0x96);
          auStack_a0._16_16_ = vpternlogq_avx512vl(auVar15,auVar3,auVar13,0x96);
          mStack_e0.w64[3] = 0x106084;
          mzd_mul_v_s128_192(amStack_80,(mzd_local_t *)auStack_a0,
                             *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar7));
          mStack_e0.w64[3] = 0x106094;
          mzd_xor_s128_256((mzd_local_t *)auStack_a0,amStack_80,
                           *(mzd_local_t **)((long)&rounds[0].constant + lVar7));
          mStack_e0.w64[3] = 0x1060a4;
          mzd_addmul_v_s128_192
                    ((mzd_local_t *)auStack_a0,key,
                     *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar7));
          lVar7 = lVar7 + 0x20;
        } while ((int)lVar7 != 0x80);
        mStack_e0.w64[3] = 0x1060c3;
        mzd_copy_s128_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
        return;
      }
      if (uVar5 != 0xff0055) {
        lowmc_s128_lowmc_256_256_38(key,x,y);
        return;
      }
      mStack_e0.w64[3] = 0x1060ff;
      mzd_copy_s128_256((mzd_local_t *)auStack_a0,x);
      mStack_e0.w64[3] = 0x106118;
      mzd_addmul_v_s128_256((mzd_local_t *)auStack_a0,key,K_0);
      lVar7 = 0;
      do {
        auVar17 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d850);
        auVar22 = vandpd_avx(auStack_a0._16_16_,_DAT_0010d860);
        auVar2 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d860);
        auVar11 = vandpd_avx(auStack_a0._16_16_,_DAT_0010d840);
        auVar12 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d870);
        auVar3 = vandpd_avx(auStack_a0._16_16_,_DAT_0010d850);
        auVar21 = vpsrldq_avx(auVar17,8);
        auVar21 = vpsrlq_avx(auVar21,0x3e);
        auVar14 = vpsllq_avx(auVar17,2);
        auVar17 = vpslldq_avx(auVar22,8);
        auVar17 = vpshldq_avx512_vbmi2(auVar22,auVar17,2);
        auVar21 = vpor_avx(auVar17,auVar21);
        auVar22 = vpaddq_avx(auVar2,auVar2);
        auVar17 = vpslldq_avx(auStack_a0._16_16_,8);
        auVar13 = vpshldq_avx512_vbmi2(auVar11,auVar17,1);
        auVar17 = vandnpd_avx(auVar12,auVar14);
        auVar11 = vpor_avx(auVar22,auVar14);
        auVar22 = vpternlogq_avx512vl(auVar14,auVar22,auVar12,0x78);
        auVar14 = vpternlogq_avx512vl(auVar13,auVar3,auVar21,0xd2);
        auVar15 = vpsrldq_avx(auVar14,8);
        auVar14 = vpshldq_avx512_vbmi2(auVar15,auVar14,0x3f);
        auVar14 = vpternlogq_avx512vl(auVar14,auVar13,auVar21,0x1e);
        auVar21 = vpternlogq_avx512vl(auVar21,auVar13,auVar3,0x78);
        auVar13 = vpslldq_avx(auVar21,8);
        auVar22 = vpshldq_avx512_vbmi2(auVar13,auVar22,0x3e);
        auVar13 = vpsrldq_avx(auVar21,8);
        auVar21 = vpshldq_avx512_vbmi2(auVar13,auVar21,0x3e);
        auVar17 = vpsrlq_avx(auVar17,1);
        auVar17 = vpternlogq_avx512vl(auVar17,auVar11,auVar2,0x96);
        auStack_a0._0_16_ = vpternlogq_avx512vl(auVar17,auVar12,auVar22,0x96);
        auStack_a0._16_16_ = vpternlogq_avx512vl(auVar14,auVar3,auVar21,0x96);
        mStack_e0.w64[3] = 0x10620c;
        mzd_mul_v_s128_256(amStack_80,(mzd_local_t *)auStack_a0,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar7));
        mStack_e0.w64[3] = 0x10621c;
        mzd_xor_s128_256((mzd_local_t *)auStack_a0,amStack_80,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar7));
        mStack_e0.w64[3] = 0x10622c;
        mzd_addmul_v_s128_256
                  ((mzd_local_t *)auStack_a0,key,
                   *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar7));
        lVar7 = lVar7 + 0x20;
      } while ((int)lVar7 != 0x80);
      mStack_e0.w64[3] = 0x10624b;
      mzd_copy_s128_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
      return;
    }
    if (uVar5 == 0x80000a) {
      mzd_xor_s128_128(&mStack_100,x,precomputed_constant_linear_part);
      plVar10 = rounds;
      mzd_addmul_v_s128_128(&mStack_100,key,precomputed_round_key_matrix_linear_part);
      mzd_mul_v_s128_128_640(&mStack_c0,key,precomputed_round_key_matrix_non_linear_part);
      mzd_xor_s128_640(&mStack_c0,&mStack_c0,precomputed_constant_non_linear_part);
      bVar9 = 0;
      uVar5 = 0;
      do {
        uVar1 = mStack_100.w64[1] * 4;
        uVar6 = mStack_100.w64[1] * 2 & 0x9249249000000000;
        uVar8 = mStack_100.w64[1] & 0x9249249000000000;
        mStack_100.w64[1] =
             *(long *)((long)(&mStack_c0)[uVar5 >> 3].w64 + (ulong)(uVar5 & 6) * 4) <<
             (~bVar9 & 0x20) & 0xffffffff00000000U ^
             (uVar6 ^ 0x9249249000000000) & uVar1 ^ uVar8 ^ uVar6 ^
             (((uVar8 ^ 0x9249249000000000) & uVar1 ^ uVar6) >> 1 |
             (mStack_100.w64[1] * 2 & uVar8 ^ uVar1 & 0x9249249000000000) >> 2 |
             mStack_100.w64[1] & 0x3ffffffff);
        mzd_mul_v_parity_uint64_128_30(&mStack_e0,&mStack_100,plVar10->z_matrix);
        mzd_shuffle_128_30(&mStack_100,plVar10->r_mask);
        mzd_addmul_v_s128_30_128(&mStack_e0,&mStack_100,plVar10->r_matrix);
        mStack_100.w64[1] = mStack_100.w64[1] & 0x3ffffffff;
        mzd_xor_s128_128(&mStack_100,&mStack_e0,&mStack_100);
        uVar5 = uVar5 + 1;
        plVar10 = plVar10 + 1;
        bVar9 = bVar9 + 0x20;
      } while (uVar5 != 0x13);
      uVar1 = mStack_100.w64[1] * 4;
      uVar6 = mStack_100.w64[1] * 2 & 0x9249249000000000;
      uVar8 = mStack_100.w64[1] & 0x9249249000000000;
      mStack_100.w64[1] =
           amStack_80[0].w64[1] & 0xffffffff00000000 ^
           (uVar6 ^ 0x9249249000000000) & uVar1 ^ uVar8 ^ uVar6 ^
           (((uVar8 ^ 0x9249249000000000) & uVar1 ^ uVar6) >> 1 |
           (mStack_100.w64[1] * 2 & uVar8 ^ uVar1 & 0x9249249000000000) >> 2 |
           mStack_100.w64[1] & 0x3ffffffff);
      mzd_mul_v_s128_128(&mStack_e0,&mStack_100,Z_r);
      mzd_copy_s128_128(&mStack_100,&mStack_e0);
      mzd_copy_s128_128(y,&mStack_100);
      return;
    }
    if (uVar5 != 0x81002b) {
      lowmc_s128_lowmc_192_192_30(key,x,y);
      return;
    }
    mStack_e0.w64[3] = 0x105dcb;
    mzd_copy_s128_256((mzd_local_t *)auStack_a0,x);
    mStack_e0.w64[3] = 0x105de4;
    mzd_addmul_v_s128_129((mzd_local_t *)auStack_a0,key,K_0);
    lVar7 = 0;
    do {
      auVar17 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d7e0);
      auVar11 = vpand_avx(auStack_a0._16_16_,_DAT_0010d7f0);
      auVar22 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d800);
      auVar12 = vpand_avx(auStack_a0._16_16_,_DAT_0010d810);
      auVar2 = vandpd_avx(auStack_a0._0_16_,_DAT_0010d820);
      auVar3 = vpand_avx(auStack_a0._16_16_,_DAT_0010d830);
      auVar21 = vpsrldq_avx(auVar17,8);
      auVar11 = vpshldq_avx512_vbmi2(auVar11,auVar21,2);
      auVar21 = vpslldq_avx(auVar17,8);
      auVar21 = vpshldq_avx512_vbmi2(auVar17,auVar21,2);
      auVar17 = vpsrldq_avx(auStack_a0._0_16_,8);
      auVar12 = vpshldq_avx512_vbmi2(auVar12,auVar17,1);
      auVar17 = vpaddq_avx(auVar22,auVar22);
      auVar13 = vpternlogq_avx512vl(auVar21,auVar17,auVar2,0x78);
      auVar14 = vpternlogq_avx512vl(auVar12,auVar3,auVar11,0xd2);
      auVar22 = vpsrlq_avx(auVar14,1);
      auVar15 = vpternlogq_avx512vl(auVar22,auVar12,auVar11,0x1e);
      auVar11 = vpternlogq_avx512vl(auVar11,auVar12,auVar3,0x78);
      auVar22 = vpor_avx(auVar17,auVar21);
      auVar12 = vpternlogq_avx512vl(auVar17,auVar2,auVar21,0xd2);
      auVar17 = vpslldq_avx(auVar11,8);
      auVar23 = vpsllq_avx(auVar17,0x3e);
      auVar17 = vpsrldq_avx(auVar13,8);
      auVar17 = vpshldq_avx512_vbmi2(auVar17,auVar13,0x3e);
      auVar17 = vpor_avx(auVar23,auVar17);
      auVar13 = vpsrlq_avx(auVar11,2);
      auVar11 = vpslldq_avx(auVar14,8);
      auVar14 = vpsllq_avx(auVar11,0x3f);
      auVar11 = vpsrldq_avx(auVar21,8);
      auVar11 = vpshldq_avx512_vbmi2(auVar11,auVar12,0x3f);
      auVar22 = vpternlogq_avx512vl(auVar11,auVar22,auVar14,0x36);
      auStack_a0._0_16_ = vpternlogq_avx512vl(auVar22,auVar2,auVar17,0x96);
      auStack_a0._16_16_ = vpternlogq_avx512vl(auVar15,auVar3,auVar13,0x96);
      mStack_e0.w64[3] = 0x105eea;
      mzd_mul_v_s128_129(amStack_80,(mzd_local_t *)auStack_a0,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar7));
      mStack_e0.w64[3] = 0x105efa;
      mzd_xor_s128_256((mzd_local_t *)auStack_a0,amStack_80,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar7));
      mStack_e0.w64[3] = 0x105f0a;
      mzd_addmul_v_s128_129
                ((mzd_local_t *)auStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar7))
      ;
      lVar7 = lVar7 + 0x20;
    } while ((int)lVar7 != 0x80);
    mStack_e0.w64[3] = 0x105f29;
    mzd_copy_s128_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
    return;
  }
  if (0xc0003f < (int)uVar5) {
    if (uVar5 == 0xc00040) {
      mStack_e0.w64[3] = 0x105477;
      mzd_copy_s256_256((mzd_local_t *)auStack_a0,x);
      mStack_e0.w64[3] = 0x105490;
      mzd_addmul_v_s256_192((mzd_local_t *)auStack_a0,key,K_0);
      lVar7 = 0;
      do {
        auVar18 = vpand_avx2(auStack_a0,_DAT_0010d700);
        auVar19 = vpand_avx2(auStack_a0,_DAT_0010d720);
        auVar4 = vpand_avx2(auStack_a0,_DAT_0010d740);
        auVar20 = vpsllq_avx2(auVar18,2);
        auVar18 = vpsrlq_avx2(auVar18,0x3e);
        auVar18 = vpermq_avx2(auVar18,0x93);
        auVar20 = vpor_avx2(auVar18,auVar20);
        auVar18 = vpaddq_avx2(auVar19,auVar19);
        auVar19 = vpsrlq_avx2(auVar19,0x3f);
        auVar19 = vpermq_avx2(auVar19,0x93);
        auVar19 = vpor_avx2(auVar19,auVar18);
        auVar18 = vpand_avx2(auVar20,auVar4);
        auVar16 = vpternlogq_avx512vl(auVar18,auVar19,auVar20,0x96);
        auVar18 = vpor_avx2(auVar20,auVar19);
        auVar19 = vpternlogq_avx512vl(auVar20,auVar19,auVar4,0x78);
        auVar20 = vpsrlq_avx2(auVar19,2);
        auVar19 = vpsllq_avx2(auVar19,0x3e);
        auVar19 = vpermq_avx2(auVar19,0x39);
        auVar19 = vpternlogq_avx512vl(auVar19,auVar18,auVar20,0x36);
        auVar20 = vpsrlq_avx2(auVar16,1);
        auVar18 = vpsllq_avx2(auVar16,0x3f);
        auVar18 = vpermq_avx2(auVar18,0x39);
        auVar18 = vpor_avx2(auVar18,auVar20);
        auStack_a0 = vpternlogq_avx512vl(auVar18,auVar4,auVar19,0x96);
        mStack_e0.w64[3] = 0x10553d;
        mzd_mul_v_s256_192(amStack_80,(mzd_local_t *)auStack_a0,
                           *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar7));
        mStack_e0.w64[3] = 0x10554d;
        mzd_xor_s256_256((mzd_local_t *)auStack_a0,amStack_80,
                         *(mzd_local_t **)((long)&rounds[0].constant + lVar7));
        mStack_e0.w64[3] = 0x10555d;
        mzd_addmul_v_s256_192
                  ((mzd_local_t *)auStack_a0,key,
                   *(mzd_local_t **)((long)&rounds[0].k_matrix + lVar7));
        lVar7 = lVar7 + 0x20;
      } while ((int)lVar7 != 0x80);
      mStack_e0.w64[3] = 0x10557c;
      mzd_copy_s256_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
      return;
    }
    if (uVar5 != 0xff0055) {
      lowmc_s256_lowmc_256_256_38(key,x,y);
      return;
    }
    mStack_e0.w64[3] = 0x1055b8;
    mzd_copy_s256_256((mzd_local_t *)auStack_a0,x);
    mStack_e0.w64[3] = 0x1055d1;
    mzd_addmul_v_s256_256((mzd_local_t *)auStack_a0,key,K_0);
    lVar7 = 0;
    do {
      auVar18 = vpand_avx2(auStack_a0,_DAT_0010d760);
      auVar19 = vpand_avx2(auStack_a0,_DAT_0010d780);
      auVar4 = vpand_avx2(auStack_a0,_DAT_0010d7a0);
      auVar20 = vpsllq_avx2(auVar18,2);
      auVar18 = vpsrlq_avx2(auVar18,0x3e);
      auVar18 = vpermq_avx2(auVar18,0x93);
      auVar20 = vpor_avx2(auVar18,auVar20);
      auVar18 = vpaddq_avx2(auVar19,auVar19);
      auVar19 = vpsrlq_avx2(auVar19,0x3f);
      auVar19 = vpermq_avx2(auVar19,0x93);
      auVar19 = vpor_avx2(auVar19,auVar18);
      auVar18 = vpand_avx2(auVar20,auVar4);
      auVar16 = vpternlogq_avx512vl(auVar18,auVar19,auVar20,0x96);
      auVar18 = vpor_avx2(auVar20,auVar19);
      auVar19 = vpternlogq_avx512vl(auVar20,auVar19,auVar4,0x78);
      auVar20 = vpsrlq_avx2(auVar19,2);
      auVar19 = vpsllq_avx2(auVar19,0x3e);
      auVar19 = vpermq_avx2(auVar19,0x39);
      auVar19 = vpternlogq_avx512vl(auVar19,auVar18,auVar20,0x36);
      auVar20 = vpsrlq_avx2(auVar16,1);
      auVar18 = vpsllq_avx2(auVar16,0x3f);
      auVar18 = vpermq_avx2(auVar18,0x39);
      auVar18 = vpor_avx2(auVar18,auVar20);
      auStack_a0 = vpternlogq_avx512vl(auVar18,auVar4,auVar19,0x96);
      mStack_e0.w64[3] = 0x10567e;
      mzd_mul_v_s256_256(amStack_80,(mzd_local_t *)auStack_a0,
                         *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar7));
      mStack_e0.w64[3] = 0x10568e;
      mzd_xor_s256_256((mzd_local_t *)auStack_a0,amStack_80,
                       *(mzd_local_t **)((long)&rounds[0].constant + lVar7));
      mStack_e0.w64[3] = 0x10569e;
      mzd_addmul_v_s256_256
                ((mzd_local_t *)auStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar7))
      ;
      lVar7 = lVar7 + 0x20;
    } while ((int)lVar7 != 0x80);
    mStack_e0.w64[3] = 0x1056bd;
    mzd_copy_s256_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
    return;
  }
  if (uVar5 == 0x80000a) {
    mzd_xor_s256_128(&mStack_100,x,precomputed_constant_linear_part);
    plVar10 = rounds;
    mzd_addmul_v_s256_128(&mStack_100,key,precomputed_round_key_matrix_linear_part);
    mzd_mul_v_s256_128_768(&mStack_c0,key,precomputed_round_key_matrix_non_linear_part);
    mzd_xor_s256_768(&mStack_c0,&mStack_c0,precomputed_constant_non_linear_part);
    bVar9 = 0;
    uVar5 = 0;
    do {
      uVar1 = mStack_100.w64[1] * 4;
      uVar6 = mStack_100.w64[1] * 2 & 0x9249249000000000;
      uVar8 = mStack_100.w64[1] & 0x9249249000000000;
      mStack_100.w64[1] =
           *(long *)((long)(&mStack_c0)[uVar5 >> 3].w64 + (ulong)(uVar5 & 6) * 4) << (~bVar9 & 0x20)
           & 0xffffffff00000000U ^
           (uVar6 ^ 0x9249249000000000) & uVar1 ^ uVar8 ^ uVar6 ^
           (((uVar8 ^ 0x9249249000000000) & uVar1 ^ uVar6) >> 1 |
           (mStack_100.w64[1] * 2 & uVar8 ^ uVar1 & 0x9249249000000000) >> 2 |
           mStack_100.w64[1] & 0x3ffffffff);
      mzd_mul_v_parity_uint64_128_30(&mStack_e0,&mStack_100,plVar10->z_matrix);
      mzd_shuffle_pext_128_30(&mStack_100,plVar10->r_mask);
      mzd_addmul_v_s256_30_128(&mStack_e0,&mStack_100,plVar10->r_matrix);
      mStack_100.w64[1] = mStack_100.w64[1] & 0x3ffffffff;
      mzd_xor_s256_128(&mStack_100,&mStack_e0,&mStack_100);
      uVar5 = uVar5 + 1;
      plVar10 = plVar10 + 1;
      bVar9 = bVar9 + 0x20;
    } while (uVar5 != 0x13);
    uVar1 = mStack_100.w64[1] * 4;
    uVar6 = mStack_100.w64[1] * 2 & 0x9249249000000000;
    uVar8 = mStack_100.w64[1] & 0x9249249000000000;
    mStack_100.w64[1] =
         amStack_80[0].w64[1] & 0xffffffff00000000 ^
         (uVar6 ^ 0x9249249000000000) & uVar1 ^ uVar8 ^ uVar6 ^
         (((uVar8 ^ 0x9249249000000000) & uVar1 ^ uVar6) >> 1 |
         (mStack_100.w64[1] * 2 & uVar8 ^ uVar1 & 0x9249249000000000) >> 2 |
         mStack_100.w64[1] & 0x3ffffffff);
    mzd_mul_v_s256_128(&mStack_e0,&mStack_100,Z_r);
    mzd_copy_s256_128(&mStack_100,&mStack_e0);
    mzd_copy_s256_128(y,&mStack_100);
    return;
  }
  if (uVar5 != 0x81002b) {
    lowmc_s256_lowmc_192_192_30(key,x,y);
    return;
  }
  mStack_e0.w64[3] = 0x105336;
  mzd_copy_s256_256((mzd_local_t *)auStack_a0,x);
  mStack_e0.w64[3] = 0x10534f;
  mzd_addmul_v_s256_129((mzd_local_t *)auStack_a0,key,K_0);
  lVar7 = 0;
  do {
    auVar18 = vpand_avx2(auStack_a0,_DAT_0010d6a0);
    auVar19 = vpand_avx2(auStack_a0,_DAT_0010d6c0);
    auVar4 = vpand_avx2(auStack_a0,_DAT_0010d6e0);
    auVar20 = vpsllq_avx2(auVar18,2);
    auVar18 = vpsrlq_avx2(auVar18,0x3e);
    auVar18 = vpermq_avx2(auVar18,0x93);
    auVar20 = vpor_avx2(auVar18,auVar20);
    auVar18 = vpaddq_avx2(auVar19,auVar19);
    auVar19 = vpsrlq_avx2(auVar19,0x3f);
    auVar19 = vpermq_avx2(auVar19,0x93);
    auVar19 = vpor_avx2(auVar19,auVar18);
    auVar18 = vpand_avx2(auVar20,auVar4);
    auVar16 = vpternlogq_avx512vl(auVar18,auVar19,auVar20,0x96);
    auVar18 = vpor_avx2(auVar20,auVar19);
    auVar19 = vpternlogq_avx512vl(auVar20,auVar19,auVar4,0x78);
    auVar20 = vpsrlq_avx2(auVar19,2);
    auVar19 = vpsllq_avx2(auVar19,0x3e);
    auVar19 = vpermq_avx2(auVar19,0x39);
    auVar19 = vpternlogq_avx512vl(auVar19,auVar18,auVar20,0x36);
    auVar20 = vpsrlq_avx2(auVar16,1);
    auVar18 = vpsllq_avx2(auVar16,0x3f);
    auVar18 = vpermq_avx2(auVar18,0x39);
    auVar18 = vpor_avx2(auVar18,auVar20);
    auStack_a0 = vpternlogq_avx512vl(auVar18,auVar4,auVar19,0x96);
    mStack_e0.w64[3] = 0x1053fc;
    mzd_mul_v_s256_129(amStack_80,(mzd_local_t *)auStack_a0,
                       *(mzd_local_t **)((long)&rounds[0].l_matrix + lVar7));
    mStack_e0.w64[3] = 0x10540c;
    mzd_xor_s256_256((mzd_local_t *)auStack_a0,amStack_80,
                     *(mzd_local_t **)((long)&rounds[0].constant + lVar7));
    mStack_e0.w64[3] = 0x10541c;
    mzd_addmul_v_s256_129
              ((mzd_local_t *)auStack_a0,key,*(mzd_local_t **)((long)&rounds[0].k_matrix + lVar7));
    lVar7 = lVar7 + 0x20;
  } while ((int)lVar7 != 0x80);
  mStack_e0.w64[3] = 0x10543b;
  mzd_copy_s256_256((mzd_local_t *)mStack_c0.w64[3],(mzd_local_t *)auStack_a0);
  return;
}

Assistant:

static inline ATTR_PURE uint32_t lowmc_get_id(const lowmc_parameters_t* lowmc) {
  return LOWMC_ID(lowmc->n, lowmc->m);
}